

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O1

QList<QFontDatabase::WritingSystem> * __thiscall
QRawFont::supportedWritingSystems
          (QList<QFontDatabase::WritingSystem> *__return_storage_ptr__,QRawFont *this)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  size_t i;
  long lVar4;
  int i_2;
  WritingSystem writingSystem;
  long in_FS_OFFSET;
  QSupportedWritingSystems ws;
  quint32 codepageRanges [2];
  QPlatformFontDatabase local_70;
  QByteArray local_68;
  WritingSystem local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (WritingSystem *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (((this->d).d.ptr)->fontEngine != (QFontEngine *)0x0) {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    fontTable(&local_68,this,"OS/2");
    if ((undefined1 *)0x56 < (ulong)local_68.d.size) {
      pcVar3 = local_68.d.ptr;
      if (local_68.d.ptr == (char *)0x0) {
        pcVar3 = (char *)&QByteArray::_empty;
      }
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      lVar4 = 0;
      do {
        uVar1 = *(uint *)(pcVar3 + lVar4 * 4 + 0x2a);
        *(uint *)((long)&local_38 + lVar4 * 4) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      lVar4 = 0;
      do {
        uVar1 = *(uint *)(pcVar3 + lVar4 * 4 + 0x4e);
        *(uint *)((long)&local_40 + lVar4 * 4) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      local_70._vptr_QPlatformFontDatabase = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      QPlatformFontDatabase::writingSystemsFromTrueTypeBits
                (&local_70,(quint32 *)&local_38,(quint32 *)&local_40);
      writingSystem = Any;
      do {
        bVar2 = QSupportedWritingSystems::supported
                          ((QSupportedWritingSystems *)&local_70,writingSystem);
        if (bVar2) {
          local_44 = writingSystem;
          QtPrivate::QPodArrayOps<QFontDatabase::WritingSystem>::
          emplace<QFontDatabase::WritingSystem&>
                    ((QPodArrayOps<QFontDatabase::WritingSystem> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_44);
          QList<QFontDatabase::WritingSystem>::end(__return_storage_ptr__);
        }
        writingSystem = writingSystem + Latin;
      } while (writingSystem != WritingSystemsCount);
      QSupportedWritingSystems::~QSupportedWritingSystems((QSupportedWritingSystems *)&local_70);
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QFontDatabase::WritingSystem> QRawFont::supportedWritingSystems() const
{
    QList<QFontDatabase::WritingSystem> writingSystems;
    if (d->isValid()) {
        QByteArray os2Table = fontTable("OS/2");
        if (os2Table.size() > 86) {
            const uchar * const data = reinterpret_cast<const uchar *>(os2Table.constData());
            const uchar * const bigEndianUnicodeRanges  = data + 42;
            const uchar * const bigEndianCodepageRanges = data + 78;

            quint32 unicodeRanges[4];
            quint32 codepageRanges[2];

            for (size_t i = 0; i < sizeof unicodeRanges / sizeof *unicodeRanges; ++i)
                unicodeRanges[i] = qFromBigEndian<quint32>(bigEndianUnicodeRanges + i * sizeof(quint32));

            for (size_t i = 0; i < sizeof codepageRanges / sizeof *codepageRanges; ++i)
                codepageRanges[i] = qFromBigEndian<quint32>(bigEndianCodepageRanges + i * sizeof(quint32));

            QSupportedWritingSystems ws = QPlatformFontDatabase::writingSystemsFromTrueTypeBits(unicodeRanges, codepageRanges);
            for (int i = 0; i < QFontDatabase::WritingSystemsCount; ++i) {
                if (ws.supported(QFontDatabase::WritingSystem(i)))
                    writingSystems.append(QFontDatabase::WritingSystem(i));
            }
        }
    }

    return writingSystems;
}